

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  size_type *psVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  bool bVar5;
  _Alloc_hider *p_Var6;
  int iVar7;
  _Node *p_Var8;
  _Node **pp_Var9;
  char *pcVar10;
  ulong *puVar11;
  ulong uVar12;
  string *psVar13;
  char *pcVar14;
  bool bVar15;
  string *__s2;
  size_type sVar16;
  _Node *p_Var17;
  _Node **pp_Var18;
  char cVar19;
  ulong uVar20;
  _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *this_00;
  float fVar21;
  float fVar22;
  float fVar23;
  pointer local_38;
  
  pcVar14 = (full_name->_M_dataplus)._M_p;
  cVar19 = *pcVar14;
  if (cVar19 == '\0') {
    uVar20 = 0;
  }
  else {
    uVar20 = 0;
    pcVar10 = pcVar14;
    do {
      pcVar10 = pcVar10 + 1;
      uVar20 = (long)cVar19 + uVar20 * 5;
      cVar19 = *pcVar10;
    } while (cVar19 != '\0');
  }
  uVar2 = (this->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  uVar12 = uVar20 % uVar2;
  __s2 = full_name;
  for (p_Var8 = (this->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets[uVar12]; p_Var8 != (_Node *)0x0; p_Var8 = p_Var8->_M_next) {
    __s2 = (string *)(p_Var8->_M_v).first;
    iVar7 = strcmp(pcVar14,(char *)__s2);
    bVar15 = iVar7 != 0;
    if (iVar7 == 0) goto LAB_001d4e42;
  }
  bVar15 = true;
LAB_001d4e42:
  if (bVar15 != false) {
    uVar3 = (this->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_element_count;
    if ((this->symbols_by_name_).
        super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
        .
        super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
        .
        super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
        ._M_rehash_policy._M_next_resize < uVar3 + 1) {
      fVar22 = (this->symbols_by_name_).
               super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
               .
               super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
               .
               super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               ._M_rehash_policy._M_max_load_factor;
      fVar23 = ((float)uVar3 + 1.0) / fVar22;
      fVar21 = (float)uVar2;
      bVar5 = fVar21 < fVar23;
      if (fVar23 <= fVar21) {
        this_00 = (_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   *)0x0;
      }
      else {
        fVar21 = fVar21 * (this->symbols_by_name_).
                          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                          .
                          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                          .
                          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                          ._M_rehash_policy._M_growth_factor;
        if (fVar21 <= fVar23) {
          fVar21 = fVar23;
        }
        fVar21 = ceilf(fVar21);
        psVar13 = (string *)0x12f;
        puVar11 = &std::tr1::__detail::__prime_list;
        do {
          __s2 = (string *)((ulong)psVar13 >> 1);
          p_Var6 = &psVar13->_M_dataplus;
          psVar13 = __s2;
          if (puVar11[(long)__s2] <
              (ulong)((long)(fVar21 - 9.223372e+18) & (long)fVar21 >> 0x3f | (long)fVar21)) {
            puVar11 = puVar11 + (long)__s2 + 1;
            psVar13 = (string *)((long)&p_Var6->_M_p + ~(ulong)__s2);
          }
        } while (0 < (long)psVar13);
        this_00 = (_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   *)*puVar11;
        fVar21 = (float)this_00;
      }
      fVar22 = ceilf(fVar22 * fVar21);
      (this->symbols_by_name_).
      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
      .
      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
      .
      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ._M_rehash_policy._M_next_resize =
           (long)(fVar22 - 9.223372e+18) & (long)fVar22 >> 0x3f | (long)fVar22;
    }
    else {
      bVar5 = false;
      this_00 = (_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                 *)0x0;
    }
    p_Var8 = (_Node *)operator_new(0x20);
    (p_Var8->_M_v).first = pcVar14;
    (p_Var8->_M_v).second.type = symbol.type;
    (p_Var8->_M_v).second.field_1 = symbol.field_1;
    p_Var8->_M_next =
         (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
          *)0x0;
    if (bVar5) {
      uVar12 = uVar20 % (ulong)this_00;
      pp_Var9 = std::tr1::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ::_M_allocate_buckets(this_00,(size_type)__s2);
      sVar4 = (this->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count;
      if (sVar4 != 0) {
        sVar16 = 0;
        do {
          pp_Var18 = (this->symbols_by_name_).
                     super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                     .
                     super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                     .
                     super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                     ._M_buckets;
          p_Var17 = pp_Var18[sVar16];
          if (p_Var17 != (_Node *)0x0) {
            pp_Var18 = pp_Var18 + sVar16;
            do {
              pcVar14 = (p_Var17->_M_v).first;
              cVar19 = *pcVar14;
              if (cVar19 == '\0') {
                uVar20 = 0;
              }
              else {
                uVar20 = 0;
                do {
                  pcVar14 = pcVar14 + 1;
                  uVar20 = (long)cVar19 + uVar20 * 5;
                  cVar19 = *pcVar14;
                } while (cVar19 != '\0');
              }
              *pp_Var18 = p_Var17->_M_next;
              p_Var17->_M_next = pp_Var9[uVar20 % (ulong)this_00];
              pp_Var9[uVar20 % (ulong)this_00] = p_Var17;
              pp_Var18 = (this->symbols_by_name_).
                         super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                         .
                         super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                         .
                         super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                         ._M_buckets + sVar16;
              p_Var17 = *pp_Var18;
            } while (p_Var17 != (_Node *)0x0);
          }
          sVar16 = sVar16 + 1;
        } while (sVar16 != sVar4);
      }
      operator_delete((this->symbols_by_name_).
                      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                      .
                      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                      .
                      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                      ._M_buckets,sVar4 * 8 + 8);
      (this->symbols_by_name_).
      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
      .
      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
      .
      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ._M_bucket_count = (size_type)this_00;
      (this->symbols_by_name_).
      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
      .
      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
      .
      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ._M_buckets = pp_Var9;
    }
    pp_Var9 = (this->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    p_Var8->_M_next = pp_Var9[uVar12];
    pp_Var9[uVar12] = p_Var8;
    psVar1 = &(this->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_element_count;
    *psVar1 = *psVar1 + 1;
    if (bVar15 != false) {
      local_38 = (full_name->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->symbols_after_checkpoint_
                 ,&local_38);
    }
  }
  return bVar15;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(
    const string& full_name, Symbol symbol) {
  if (InsertIfNotPresent(&symbols_by_name_, full_name.c_str(), symbol)) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}